

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_991178::NotInProjectDir::operator()(NotInProjectDir *this,string *path)

{
  bool bVar1;
  bool local_29;
  string *path_local;
  NotInProjectDir *this_local;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    bVar1 = IsInDirectory(&this->SourceDir,path);
    local_29 = true;
    if (!bVar1) {
      local_29 = IsInDirectory(&this->BinaryDir,path);
    }
    this_local._7_1_ = (bool)((local_29 ^ 0xffU) & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const std::string& path) const
  {
    // Keep all relative paths:
    if (!cmSystemTools::FileIsFullPath(path)) {
      return false;
    }
    // If it's an absolute path, check if it starts with the source
    // direcotory:
    return (
      !(IsInDirectory(SourceDir, path) || IsInDirectory(BinaryDir, path)));
  }